

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

int DisplayKeys(void)

{
  printf("On OpenCVGUI : \n");
  printf("%c%c%c%c(horizontal control),fvB(vertical control or thrust limit),%c%c(lateral),%c(brake),space(stop),g(generalstop),t%c%cUHT(heading, depth or sail, alt_agl, pitch, roll, obstacle avoidance control),o(toggle OSD),c(toggle North and control),m(toggle map),M(toggle Map),*(rotate map),i(toggle image),$(toggle sonar),;(other overlays),X(disableopencvgui),+-(coordspace zoom),O(gpssetenvcoordposition),G(gpslocalization),J(enable/disableautogpslocalization),V(enable/disableautodvllocalization),Z(resetstateestimation),S(staticsonarlocalization),D(enable/disabledynamicsonarlocalization),P(snapshot),r(record),p(mission),x(abort),h(help),!(alarms),?(battery),bn(lights),uNj(camera tilt),R(alt RC mode),F(override inputs),.(rearm),0(disarm),ENTER(extended menu),ESC(exit)\n"
         ,(ulong)(uint)(int)keys[0],(ulong)(uint)(int)keys[1],(ulong)(uint)(int)keys[2],
         (ulong)(uint)(int)keys[3],(ulong)(uint)(int)keys[4],(int)keys[5],(int)keys[6],(int)keys[7],
         (int)keys[8]);
  return 0;
}

Assistant:

inline int DisplayKeys(void)
{
	printf("On OpenCVGUI : \n");
	printf("%c%c%c%c(horizontal control),fvB(vertical control or thrust limit),%c%c(lateral),%c(brake),space(stop),g(generalstop),t%c%cUHT(heading, depth or sail, alt_agl, pitch, roll, obstacle avoidance control),"
		"o(toggle OSD),c(toggle North and control),"
		"m(toggle map),M(toggle Map),*(rotate map),i(toggle image),$(toggle sonar),;(other overlays),X(disableopencvgui),+-(coordspace zoom),"
		"O(gpssetenvcoordposition),G(gpslocalization),J(enable/disableautogpslocalization),V(enable/disableautodvllocalization),"
		"Z(resetstateestimation),S(staticsonarlocalization),D(enable/disabledynamicsonarlocalization),"
		"P(snapshot),r(record),p(mission),x(abort),h(help),!(alarms),?(battery),"
		"bn(lights),uNj(camera tilt),R(alt RC mode),F(override inputs),.(rearm),0(disarm),"
		"ENTER(extended menu),ESC(exit)\n", 
		keys[FWD_KEY], keys[BWD_KEY], keys[LEFT_KEY], keys[RIGHT_KEY], keys[LAT_LEFT_KEY], keys[LAT_RIGHT_KEY], 
		keys[BRAKE_KEY], keys[DEPTHCONTROL_KEY], keys[ALTITUDEAGLCONTROL_KEY]);

	return EXIT_SUCCESS;
}